

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeMessageNoTable(MessageLite *msg,ArrayOutput *output)

{
  int iVar1;
  undefined1 local_88 [8];
  CodedOutputStream o;
  ArrayOutputStream array_stream;
  ArrayOutput *output_local;
  MessageLite *msg_local;
  
  io::ArrayOutputStream::ArrayOutputStream
            ((ArrayOutputStream *)&o.start_count_,output->ptr,0x7fffffff,-1);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)local_88,(ZeroCopyOutputStream *)&o.start_count_);
  io::CodedOutputStream::SetSerializationDeterministic
            ((CodedOutputStream *)local_88,(bool)(output->is_deterministic & 1));
  MessageLite::SerializeWithCachedSizes(msg,(CodedOutputStream *)local_88);
  iVar1 = io::CodedOutputStream::ByteCount((CodedOutputStream *)local_88);
  output->ptr = output->ptr + iVar1;
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_88);
  io::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&o.start_count_);
  return;
}

Assistant:

void SerializeMessageNoTable(const MessageLite* msg, ArrayOutput* output) {
  io::ArrayOutputStream array_stream(output->ptr, INT_MAX);
  io::CodedOutputStream o(&array_stream);
  o.SetSerializationDeterministic(output->is_deterministic);
  msg->SerializeWithCachedSizes(&o);
  output->ptr += o.ByteCount();
}